

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON__CNewMeshFace>::Append(ON_SimpleArray<ON__CNewMeshFace> *this,ON__CNewMeshFace *x)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ON_2fPoint OVar4;
  ON_2fPoint OVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  ON__CNewMeshFace *pOVar14;
  ON__CNewMeshFace *pOVar15;
  
  iVar13 = this->m_count;
  pOVar14 = x;
  if (iVar13 == this->m_capacity) {
    iVar13 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar14 = (ON__CNewMeshFace *)onmalloc(0x2c);
      iVar6 = x->newvcnt;
      bVar7 = x->bNewV[0];
      bVar8 = x->bNewV[1];
      bVar9 = x->bNewV[2];
      bVar10 = x->bNewV[3];
      fVar11 = x->tc[0].x;
      uVar2 = *(undefined8 *)&x->tc[0].y;
      uVar3 = *(undefined8 *)&x->tc[1].y;
      OVar4 = x->tc[2];
      OVar5 = x->tc[3];
      pOVar14->fi = x->fi;
      pOVar14->newvcnt = iVar6;
      pOVar14->bNewV[0] = bVar7;
      pOVar14->bNewV[1] = bVar8;
      pOVar14->bNewV[2] = bVar9;
      pOVar14->bNewV[3] = bVar10;
      pOVar14->tc[0].x = fVar11;
      *(undefined8 *)&pOVar14->tc[0].y = uVar2;
      *(undefined8 *)&pOVar14->tc[1].y = uVar3;
      pOVar14->tc[2] = OVar4;
      pOVar14->tc[3] = OVar5;
    }
    Reserve(this,(long)iVar13);
    pOVar15 = this->m_a;
    if (pOVar15 == (ON__CNewMeshFace *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar13 = this->m_count;
  }
  else {
    pOVar15 = this->m_a;
  }
  this->m_count = iVar13 + 1;
  iVar6 = pOVar14->fi;
  iVar12 = pOVar14->newvcnt;
  bVar7 = pOVar14->bNewV[0];
  bVar8 = pOVar14->bNewV[1];
  bVar9 = pOVar14->bNewV[2];
  bVar10 = pOVar14->bNewV[3];
  fVar11 = pOVar14->tc[0].x;
  uVar2 = *(undefined8 *)&pOVar14->tc[0].y;
  uVar3 = *(undefined8 *)&pOVar14->tc[1].y;
  OVar4 = pOVar14->tc[3];
  pOVar15[iVar13].tc[2] = pOVar14->tc[2];
  (pOVar15[iVar13].tc + 2)[1] = OVar4;
  pfVar1 = &pOVar15[iVar13].tc[0].y;
  *(undefined8 *)pfVar1 = uVar2;
  *(undefined8 *)(pfVar1 + 2) = uVar3;
  pOVar15 = pOVar15 + iVar13;
  pOVar15->fi = iVar6;
  pOVar15->newvcnt = iVar12;
  pOVar15->bNewV[0] = bVar7;
  pOVar15->bNewV[1] = bVar8;
  pOVar15->bNewV[2] = bVar9;
  pOVar15->bNewV[3] = bVar10;
  pOVar15->tc[0].x = fVar11;
  if (pOVar14 != x) {
    onfree(pOVar14);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}